

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_slice.c
# Opt level: O0

size_t slice_fwrite(ALLEGRO_FILE *f,void *ptr,size_t size)

{
  void *pvVar1;
  long in_RDX;
  ALLEGRO_FILE *in_RDI;
  size_t b;
  SLICE_DATA *slice;
  void *in_stack_ffffffffffffffc8;
  ALLEGRO_FILE *in_stack_ffffffffffffffd0;
  long local_20;
  size_t local_8;
  
  pvVar1 = al_get_file_userdata(in_RDI);
  if ((*(uint *)((long)pvVar1 + 0x20) & 2) == 0) {
    local_8 = 0;
  }
  else {
    local_20 = in_RDX;
    if (((*(uint *)((long)pvVar1 + 0x20) & 4) == 0) &&
       (*(ulong *)((long)pvVar1 + 0x18) < (ulong)(*(long *)((long)pvVar1 + 0x10) + in_RDX))) {
      local_20 = *(long *)((long)pvVar1 + 0x18) - *(long *)((long)pvVar1 + 0x10);
    }
    if (local_20 == 0) {
      local_8 = 0;
    }
    else {
      local_8 = al_fwrite(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x1764fa);
      *(size_t *)((long)pvVar1 + 0x10) = local_8 + *(long *)((long)pvVar1 + 0x10);
      if (*(ulong *)((long)pvVar1 + 0x18) < *(ulong *)((long)pvVar1 + 0x10)) {
        *(undefined8 *)((long)pvVar1 + 0x18) = *(undefined8 *)((long)pvVar1 + 0x10);
      }
    }
  }
  return local_8;
}

Assistant:

static size_t slice_fwrite(ALLEGRO_FILE *f, const void *ptr, size_t size)
{
   SLICE_DATA *slice = al_get_file_userdata(f);
   
   if (!(slice->mode & SLICE_WRITE)) {
      /* no write permissions */
      return 0;
   }
   
   if (!(slice->mode & SLICE_EXPANDABLE) && slice->pos + size > slice->size) {
      /* don't write past the buffer size if not expandable */
      size = slice->size - slice->pos;
   }
   
   if (!size) {
      return 0;
   }
   else {
      /* unbuffered, write directly to parent file */
      size_t b = al_fwrite(slice->fp, ptr, size);
      slice->pos += b;
   
      if (slice->pos > slice->size)
         slice->size = slice->pos;
      
      return b;
   }
}